

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelpers.cpp
# Opt level: O0

int StringHelpers::stringToNumber(string *s)

{
  int iVar1;
  byte bVar2;
  long *plVar3;
  int local_194;
  istringstream local_190 [4];
  int result;
  istringstream convert;
  string *s_local;
  
  std::__cxx11::istringstream::istringstream(local_190,s,8);
  plVar3 = (long *)std::istream::operator>>((istream *)local_190,&local_194);
  bVar2 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar2 & 1) != 0) {
    local_194 = 0;
  }
  iVar1 = local_194;
  std::__cxx11::istringstream::~istringstream(local_190);
  return iVar1;
}

Assistant:

int StringHelpers::stringToNumber(string s)
{
	istringstream convert(s);
	int result;
	if (!(convert >> result))
	{
		result = 0;
	}
	return result;
}